

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscroller.cpp
# Opt level: O0

bool __thiscall
QScrollerPrivate::scrollingSegmentsValid(QScrollerPrivate *this,Orientation orientation)

{
  double dVar1;
  bool bVar2;
  ScrollSegment *pSVar3;
  ulong uVar4;
  int in_ESI;
  long in_RDI;
  qreal qVar5;
  qreal nextSnap;
  qreal stopPos;
  ScrollSegment *last;
  qreal maxPos;
  qreal minPos;
  QQueue<QScrollerPrivate::ScrollSegment> *segments;
  QList<QScrollerPrivate::ScrollSegment> *in_stack_ffffffffffffffa8;
  double local_30;
  double local_28;
  bool local_1;
  
  if (in_ESI == 1) {
    local_28 = QRectF::left((QRectF *)(in_RDI + 0x48));
    local_30 = QRectF::right((QRectF *)(in_RDI + 0x48));
  }
  else {
    local_28 = QRectF::top((QRectF *)(in_RDI + 0x48));
    local_30 = QRectF::bottom((QRectF *)(in_RDI + 0x48));
  }
  bVar2 = QList<QScrollerPrivate::ScrollSegment>::isEmpty
                    ((QList<QScrollerPrivate::ScrollSegment> *)0xa87335);
  if (bVar2) {
    local_1 = true;
  }
  else {
    pSVar3 = QList<QScrollerPrivate::ScrollSegment>::last(in_stack_ffffffffffffffa8);
    dVar1 = pSVar3->stopPos;
    if (pSVar3->type == ScrollTypeScrollTo) {
      local_1 = true;
    }
    else if (((pSVar3->type == ScrollTypeOvershoot) &&
             ((dVar1 != local_28 || (NAN(dVar1) || NAN(local_28))))) &&
            ((dVar1 != local_30 || (NAN(dVar1) || NAN(local_30))))) {
      local_1 = false;
    }
    else if ((dVar1 < local_28) || (local_30 < dVar1)) {
      local_1 = false;
    }
    else if (((dVar1 == local_28) && (!NAN(dVar1) && !NAN(local_28))) ||
            ((dVar1 == local_30 && (!NAN(dVar1) && !NAN(local_30))))) {
      local_1 = true;
    }
    else {
      qVar5 = nextSnapPos((QScrollerPrivate *)segments,minPos,maxPos._4_4_,maxPos._0_4_);
      uVar4 = qIsNaN(qVar5);
      if (((uVar4 & 1) == 0) && ((dVar1 != qVar5 || (NAN(dVar1) || NAN(qVar5))))) {
        local_1 = false;
      }
      else {
        local_1 = true;
      }
    }
  }
  return local_1;
}

Assistant:

bool QScrollerPrivate::scrollingSegmentsValid(Qt::Orientation orientation) const
{
    const QQueue<ScrollSegment> *segments;
    qreal minPos;
    qreal maxPos;

    if (orientation == Qt::Horizontal) {
        segments = &xSegments;
        minPos = contentPosRange.left();
        maxPos = contentPosRange.right();
    } else {
        segments = &ySegments;
        minPos = contentPosRange.top();
        maxPos = contentPosRange.bottom();
    }

    if (segments->isEmpty())
        return true;

    const ScrollSegment &last = segments->last();
    qreal stopPos = last.stopPos;

    if (last.type == ScrollTypeScrollTo)
        return true; // scrollTo is always valid

    if (last.type == ScrollTypeOvershoot &&
        (stopPos != minPos && stopPos != maxPos))
        return false;

    if (stopPos < minPos || stopPos > maxPos)
        return false;

    if (stopPos == minPos || stopPos == maxPos) // the begin and the end of the list are always ok
        return true;

    qreal nextSnap = nextSnapPos(stopPos, 0, orientation);
    if (!qIsNaN(nextSnap) && stopPos != nextSnap)
        return false;

    return true;
}